

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setInitialStateCovariance
          (AttitudeQuaternionEKF *this,double orientation_var,double ang_vel_var,
          double gyro_bias_var)

{
  byte bVar1;
  Span<double,__1L> *this_00;
  long in_RDI;
  bool ok;
  Span<double,__1L> P_span;
  Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_> Id4;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> Id3;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> P_eig;
  MatrixDynSize P;
  undefined6 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
  *in_stack_fffffffffffffde0;
  Index in_stack_fffffffffffffde8;
  MatrixDynSize *this_01;
  MatrixDynSize *in_stack_fffffffffffffe08;
  Span<double,__1L> *in_stack_fffffffffffffe20;
  DiscreteExtendedKalmanFilterHelper *in_stack_fffffffffffffe28;
  MatrixDynSize local_48 [72];
  
  this_01 = local_48;
  iDynTree::MatrixDynSize::MatrixDynSize
            (this_01,*(ulong *)(in_RDI + 0x3d8),*(ulong *)(in_RDI + 0x3d8));
  toEigen(in_stack_fffffffffffffe08);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
  toEigen<4u,4u>((MatrixFixSize<4U,_4U> *)this_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffe28,(double *)in_stack_fffffffffffffe20);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<4,4>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,in_RDI,in_stack_fffffffffffffde8);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,4,4,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_4,_4,_false>
             *)in_stack_fffffffffffffde0,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffe28,(double *)in_stack_fffffffffffffe20);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,in_RDI,in_stack_fffffffffffffde8);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=(in_stack_fffffffffffffde0,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffe28,(double *)in_stack_fffffffffffffe20);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)this_01,in_RDI,in_stack_fffffffffffffde8);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=(in_stack_fffffffffffffde0,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
  iDynTree::MatrixDynSize::data();
  this_00 = (Span<double,__1L> *)iDynTree::MatrixDynSize::capacity();
  Span<double,_-1L>::Span
            (this_00,(pointer)CONCAT17(in_stack_fffffffffffffddf,
                                       CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)
                                      ),0x621281);
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetStateCovariance
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setInitialStateCovariance(double orientation_var, double ang_vel_var, double gyro_bias_var)
{
    using iDynTree::toEigen;

    iDynTree::MatrixDynSize P(m_state_size, m_state_size);

    auto P_eig(toEigen(P));
    auto Id3(toEigen(m_Id3));
    auto Id4(toEigen(m_Id4));

    P_eig.block<4,4>(0,0) = Id4*orientation_var;
    P_eig.block<3,3>(4,4) = Id3*ang_vel_var;
    P_eig.block<3,3>(7,7) = Id3*gyro_bias_var;

    iDynTree::Span<double> P_span(P.data(), P.capacity());
    bool ok = ekfSetStateCovariance(P_span);
    return ok;
}